

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

void __thiscall
jbcoin::STObject::setFieldUsingAssignment<jbcoin::STArray>
          (STObject *this,SField *field,STArray *value)

{
  int iVar1;
  STArray *local_48;
  STArray *cf;
  STBase *rf;
  STArray *value_local;
  SField *field_local;
  STObject *this_local;
  
  cf = (STArray *)getPField(this,field,true);
  if (cf == (STArray *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*(cf->super_STBase)._vptr_STBase[4])();
  if (iVar1 == 0) {
    cf = (STArray *)makeFieldPresent(this,field);
  }
  if (cf == (STArray *)0x0) {
    local_48 = (STArray *)0x0;
  }
  else {
    local_48 = (STArray *)__dynamic_cast(cf,&STBase::typeinfo,&STArray::typeinfo,0);
  }
  if (local_48 == (STArray *)0x0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
  }
  STArray::operator=(local_48,value);
  return;
}

Assistant:

void setFieldUsingAssignment (SField const& field, T const& value)
    {
        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        (*cf) = value;
    }